

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QStorageInfo *s)

{
  long lVar1;
  bool bVar2;
  QStorageInfoPrivate *pQVar3;
  QDebug *this;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QStorageInfoPrivate *d;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff28;
  char in_stack_ffffffffffffff2f;
  QDebugStateSaver *in_stack_ffffffffffffff30;
  QString *in_stack_ffffffffffffff38;
  QDebug *in_stack_ffffffffffffff40;
  QDebug *in_stack_ffffffffffffff48;
  QDebugStateSaver *in_stack_ffffffffffffff50;
  QDebug *in_stack_ffffffffffffff58;
  QDebug *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  QDebug::nospace(in_RSI);
  QDebug::noquote(in_RSI);
  QDebug::operator<<(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88);
  bVar2 = QStorageInfo::isValid((QStorageInfo *)0x2f4a9f);
  if (bVar2) {
    pQVar3 = QExplicitlySharedDataPointer<QStorageInfoPrivate>::constData
                       ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)0x2f4ab5);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
    QDebug::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
    bVar2 = QByteArray::isEmpty((QByteArray *)0x2f4b15);
    if (!bVar2) {
      QDebug::operator<<(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88);
      QDebug::operator<<(in_stack_ffffffffffffff40,(QByteArray *)in_stack_ffffffffffffff38);
    }
    bVar2 = QString::isEmpty((QString *)0x2f4b89);
    if (!bVar2) {
      in_stack_ffffffffffffff88 =
           QDebug::operator<<(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88);
      QDebug::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
    }
    bVar2 = QByteArray::isEmpty((QByteArray *)0x2f4be9);
    if (!bVar2) {
      QDebug::operator<<(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88);
      QDebug::operator<<(in_stack_ffffffffffffff40,(QByteArray *)in_stack_ffffffffffffff38);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
    }
    bVar2 = QByteArray::isEmpty((QByteArray *)0x2f4c49);
    if (!bVar2) {
      QDebug::operator<<(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88);
      QDebug::operator<<(in_stack_ffffffffffffff40,(QByteArray *)in_stack_ffffffffffffff38);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
    }
    if ((pQVar3->readOnly & 1U) != 0) {
      QDebug::operator<<(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88);
    }
    QDebug::operator<<(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88);
    if (0 < pQVar3->bytesTotal) {
      this = QDebug::operator<<(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,
                         CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      QDebug::operator<<(this,(char *)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff40 =
           QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,
                              CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      in_stack_ffffffffffffff38 =
           (QString *)QDebug::operator<<(this,(char *)in_stack_ffffffffffffff88);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,
                         CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    }
  }
  else {
    QDebug::operator<<(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff88);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
  QDebug::QDebug(in_stack_ffffffffffffff40,(QDebug *)in_stack_ffffffffffffff38);
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QStorageInfo &s)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug.noquote();
    debug << "QStorageInfo(";
    if (s.isValid()) {
        const QStorageInfoPrivate *d = s.d.constData();
        debug << '"' << d->rootPath << '"';
        if (!d->fileSystemType.isEmpty())
            debug << ", type=" << d->fileSystemType;
        if (!d->name.isEmpty())
            debug << ", name=\"" << d->name << '"';
        if (!d->device.isEmpty())
            debug << ", device=\"" << d->device << '"';
        if (!d->subvolume.isEmpty())
            debug << ", subvolume=\"" << d->subvolume << '"';
        if (d->readOnly)
            debug << " [read only]";
        debug << (d->ready ? " [ready]" : " [not ready]");
        if (d->bytesTotal > 0) {
            debug << ", bytesTotal=" << d->bytesTotal << ", bytesFree=" << d->bytesFree
                  << ", bytesAvailable=" << d->bytesAvailable;
        }
    } else {
        debug << "invalid";
    }
    debug << ')';
    return debug;
}